

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O3

void __thiscall
pstd::pmr::polymorphic_allocator<std::byte>::
construct<pbrt::TriangleMesh,pbrt::Transform_const&,bool&,std::vector<int,std::allocator<int>>,std::vector<pbrt::Point3<float>,std::allocator<pbrt::Point3<float>>>,std::vector<pbrt::Vector3<float>,std::allocator<pbrt::Vector3<float>>>,std::vector<pbrt::Normal3<float>,std::allocator<pbrt::Normal3<float>>>,std::vector<pbrt::Point2<float>,std::allocator<pbrt::Point2<float>>>,std::vector<int,std::allocator<int>>>
          (polymorphic_allocator<std::byte> *this,TriangleMesh *p,Transform *args,bool *args_1,
          vector<int,_std::allocator<int>_> *args_2,
          vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *args_3,
          vector<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_> *args_4,
          vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> *args_5,
          vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> *args_6,
          vector<int,_std::allocator<int>_> *args_7)

{
  bool reverseOrientation;
  pointer pPVar1;
  pointer pPVar2;
  vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> n;
  vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> uv;
  vector<int,_std::allocator<int>_> faceIndices;
  undefined1 auVar3 [16];
  undefined8 in_stack_ffffffffffffff20;
  pointer piVar4;
  pointer piVar5;
  undefined8 in_stack_ffffffffffffff40;
  pointer pPVar6;
  pointer local_98;
  pointer pNStack_90;
  pointer local_88;
  vector<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_> local_78;
  vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> local_58;
  vector<int,_std::allocator<int>_> local_38;
  
  local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (args_2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
       _M_start;
  local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (args_2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  reverseOrientation = *args_1;
  auVar3 = ZEXT816(0) << 0x20;
  local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (args_2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  (args_2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (args_2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start =
       (pointer)auVar3._0_8_;
  (args_2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
       = (pointer)auVar3._8_8_;
  local_58.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>._M_impl.
  super__Vector_impl_data._M_start =
       (args_3->super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>).
       _M_impl.super__Vector_impl_data._M_start;
  local_58.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (args_3->super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  local_58.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (args_3->super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>).
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (args_3->super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (args_3->super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)auVar3._0_8_;
  (args_3->super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)auVar3._8_8_;
  local_78.super__Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>._M_impl.
  super__Vector_impl_data._M_start =
       (args_4->super__Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>).
       _M_impl.super__Vector_impl_data._M_start;
  local_78.super__Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (args_4->super__Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  local_78.super__Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (args_4->super__Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>).
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (args_4->super__Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>)._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (args_4->super__Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>)._M_impl
  .super__Vector_impl_data._M_start = (pointer)auVar3._0_8_;
  (args_4->super__Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>)._M_impl
  .super__Vector_impl_data._M_finish = (pointer)auVar3._8_8_;
  local_98 = (args_5->
             super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
  pNStack_90 = (args_5->
               super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>).
               _M_impl.super__Vector_impl_data._M_finish;
  local_88 = (args_5->
             super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>).
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  (args_5->super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>)._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (args_5->super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>)._M_impl
  .super__Vector_impl_data._M_start = (pointer)auVar3._0_8_;
  (args_5->super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>)._M_impl
  .super__Vector_impl_data._M_finish = (pointer)auVar3._8_8_;
  pPVar6 = (args_6->super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pPVar1 = (args_6->super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>).
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  (args_6->super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (args_6->super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)auVar3._0_8_;
  (args_6->super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)auVar3._8_8_;
  piVar4 = (args_7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  pPVar2 = (pointer)(args_7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_finish;
  piVar5 = (args_7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
  (args_7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (args_7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start =
       (pointer)auVar3._0_8_;
  (args_7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
       = (pointer)auVar3._8_8_;
  n.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)&stack0xffffffffffffff48;
  n.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&local_98;
  n.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&stack0xffffffffffffff28;
  uv.super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)piVar4;
  uv.super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffff20;
  uv.super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pPVar2;
  faceIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)in_stack_ffffffffffffff40;
  faceIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = piVar5;
  faceIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)pPVar6;
  pbrt::TriangleMesh::TriangleMesh
            (p,args,reverseOrientation,&local_38,&local_58,&local_78,n,uv,faceIndices);
  if (piVar4 != (pointer)0x0) {
    operator_delete(piVar4,(long)piVar5 - (long)piVar4);
  }
  if (pPVar6 != (pointer)0x0) {
    operator_delete(pPVar6,(long)pPVar1 - (long)pPVar6);
  }
  if (local_98 != (pointer)0x0) {
    operator_delete(local_98,(long)local_88 - (long)local_98);
  }
  if (local_78.super__Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.
                    super__Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.
                          super__Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.
                          super__Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_58.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.
                    super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.
                          super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.
                          super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void construct(T *p, Args &&... args) {
        ::new ((void *)p) T(std::forward<Args>(args)...);
    }